

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  TargetType targetType;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  pointer pcVar8;
  int *piVar9;
  ostringstream e;
  char *local_1c8 [4];
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  poVar5 = std::operator<<(&local_1a8,"The inter-target dependency graph contains the following ");
  std::operator<<(poVar5,"strongly connected component (cycle):\n");
  pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (piVar9 = *(int **)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl;
      piVar9 != *(pointer *)
                 ((long)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      piVar9 = piVar9 + 1) {
    iVar1 = *piVar9;
    pcVar3 = (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1];
    poVar5 = std::operator<<(&local_1a8,"  \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,"\" of type ");
    targetType = cmGeneratorTarget::GetType(pcVar3);
    pcVar7 = cmState::GetTargetTypeName(targetType);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::operator<<(poVar5,"\n");
    pcVar4 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pcVar8 = *(pointer *)
                   &pcVar4[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar8 != *(pointer *)
                   ((long)&pcVar4[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                           super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        pcVar8 = pcVar8 + 1) {
      if ((ccg->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[pcVar8->Dest] == c) {
        pcVar3 = (this->Targets).
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pcVar8->Dest];
        poVar5 = std::operator<<(&local_1a8,"    depends on \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5," (");
        pcVar7 = "weak";
        if (pcVar8->Strong != false) {
          pcVar7 = "strong";
        }
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::operator<<(poVar5,")\n");
      }
    }
  }
  if (strong) {
    poVar5 = std::operator<<(&local_1a8,
                             "The component contains at least one cycle consisting of strong ");
    pcVar7 = "dependencies (created by add_dependencies) that cannot be broken.";
  }
  else if (this->NoCycles == true) {
    poVar5 = std::operator<<(&local_1a8,
                             "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ");
    pcVar7 = "cyclic dependencies are not allowed even among static libraries.";
  }
  else {
    poVar5 = std::operator<<(&local_1a8,"At least one of these targets is not a STATIC_LIBRARY.  ");
    pcVar7 = "Cyclic dependencies are allowed only among static libraries.";
  }
  std::operator<<(poVar5,pcVar7);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(local_1c8[0],(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (NodeList::const_iterator ci = cl.begin(); ci != cl.end(); ++ci) {
    // Get the depender.
    int i = *ci;
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni->IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str().c_str());
}